

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O0

Int __thiscall ipx::ForrestTomlin::_Update(ForrestTomlin *this,double pivot)

{
  Int IVar1;
  size_type sVar2;
  Int *pIVar3;
  double *pdVar4;
  ostream *poVar5;
  SparseMatrix *this_00;
  int iVar6;
  long in_RDI;
  bool bVar7;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Int l_2;
  double max_eta;
  Int l_1;
  Int end;
  Int l;
  double rel_newdiag_err;
  double newdiag_err;
  double newdiag2;
  double newdiag1;
  double olddiag;
  Int where;
  Int qend;
  Int num_updates;
  double in_stack_fffffffffffffeb8;
  SparseMatrix *in_stack_fffffffffffffec0;
  string *psVar8;
  value_type_conflict2 *in_stack_fffffffffffffec8;
  SparseMatrix *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee8;
  Int IVar9;
  undefined4 in_stack_fffffffffffffeec;
  SparseMatrix *in_stack_fffffffffffffef0;
  double dVar10;
  double local_e8;
  string local_c8 [48];
  string local_98 [32];
  double local_78;
  Int local_6c;
  double local_68;
  int local_5c;
  Int local_58;
  int local_54;
  double local_50;
  double local_40;
  double local_38;
  double local_30;
  int local_24;
  int local_20;
  int local_1c;
  double local_18;
  Int local_4;
  
  local_18 = in_XMM0_Qa;
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220));
  local_1c = (int)sVar2;
  local_20 = SparseMatrix::queue_size((SparseMatrix *)0x81cae9);
  local_24 = 0;
  while( true ) {
    bVar7 = false;
    if (local_24 < local_20) {
      pIVar3 = SparseMatrix::qindex
                         (in_stack_fffffffffffffec0,(Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20))
      ;
      bVar7 = *pIVar3 != *(int *)(in_RDI + 0x238);
    }
    if (!bVar7) break;
    local_24 = local_24 + 1;
  }
  this_00 = (SparseMatrix *)(in_RDI + 0x120);
  SparseMatrix::end(in_stack_fffffffffffffec0,(Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  pdVar4 = SparseMatrix::value(in_stack_fffffffffffffec0,
                               (Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  local_30 = *pdVar4;
  local_38 = local_18 * local_30;
  if (local_24 == local_20) {
    local_e8 = 0.0;
  }
  else {
    pdVar4 = SparseMatrix::qvalue
                       (in_stack_fffffffffffffec0,(Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    local_e8 = *pdVar4;
  }
  iVar6 = (int)in_RDI + 0x120;
  local_40 = SparseDot(in_stack_fffffffffffffef0,
                       (SparseMatrix *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                      );
  local_40 = local_e8 - local_40;
  std::abs(iVar6);
  std::abs(iVar6);
  local_50 = extraout_XMM0_Qa / extraout_XMM0_Qa_00;
  if (local_24 < local_20) {
    for (local_54 = local_24; IVar9 = (Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
        local_54 < local_20 + -1; local_54 = local_54 + 1) {
      pIVar3 = SparseMatrix::qindex(in_stack_fffffffffffffec0,IVar9);
      IVar9 = *pIVar3;
      pIVar3 = SparseMatrix::qindex
                         (in_stack_fffffffffffffec0,(Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20))
      ;
      *pIVar3 = IVar9;
      pdVar4 = SparseMatrix::qvalue
                         (in_stack_fffffffffffffec0,(Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20))
      ;
      dVar10 = *pdVar4;
      pdVar4 = SparseMatrix::qvalue
                         (in_stack_fffffffffffffec0,(Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20))
      ;
      *pdVar4 = dVar10;
    }
    iVar6 = *(int *)(in_RDI + 0x18) + local_1c;
    pIVar3 = SparseMatrix::qindex(in_stack_fffffffffffffec0,IVar9);
    *pIVar3 = iVar6;
    dVar10 = local_38;
    pdVar4 = SparseMatrix::qvalue
                       (in_stack_fffffffffffffec0,(Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    *pdVar4 = dVar10;
  }
  else {
    SparseMatrix::push_back
              (in_stack_fffffffffffffed0,(Int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
               (double)in_stack_fffffffffffffec0);
  }
  local_58 = SparseMatrix::end(in_stack_fffffffffffffec0,
                               (Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  for (local_5c = SparseMatrix::begin(in_stack_fffffffffffffec0,
                                      (Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      IVar9 = (Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20), local_5c < local_58 + -1;
      local_5c = local_5c + 1) {
    pdVar4 = SparseMatrix::value(in_stack_fffffffffffffec0,IVar9);
    *pdVar4 = 0.0;
  }
  pdVar4 = SparseMatrix::value(in_stack_fffffffffffffec0,IVar9);
  *pdVar4 = 1.0;
  SparseMatrix::add_column(this_00);
  SparseMatrix::add_column(this_00);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  *(undefined4 *)(in_RDI + 0x238) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x23c) = 0;
  *(undefined1 *)(in_RDI + 0x23d) = 0;
  if ((local_38 != 0.0) || (NAN(local_38))) {
    local_68 = 0.0;
    local_6c = SparseMatrix::begin(in_stack_fffffffffffffec0,
                                   (Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    while( true ) {
      IVar9 = local_6c;
      IVar1 = SparseMatrix::end(in_stack_fffffffffffffec0,
                                (Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      if (IVar1 <= IVar9) break;
      iVar6 = (int)in_RDI + 0x1a0;
      SparseMatrix::value(in_stack_fffffffffffffec0,(Int)((ulong)in_stack_fffffffffffffeb8 >> 0x20))
      ;
      std::abs(iVar6);
      pdVar4 = std::max<double>(&local_68,&local_78);
      local_68 = *pdVar4;
      local_6c = local_6c + 1;
    }
    if (10000000000.0 < local_68) {
      poVar5 = Control::Debug(*(Control **)(in_RDI + 0x10),3);
      poVar5 = std::operator<<(poVar5," max eta = ");
      sci2_abi_cxx11_(in_stack_fffffffffffffeb8);
      poVar5 = std::operator<<(poVar5,local_98);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string(local_98);
    }
    if (local_50 <= 1e-08) {
      local_4 = 0;
    }
    else {
      poVar5 = Control::Debug(*(Control **)(in_RDI + 0x10),3);
      poVar5 = std::operator<<(poVar5," relative error in new diagonal entry of U = ");
      psVar8 = local_c8;
      sci2_abi_cxx11_((double)poVar5);
      poVar5 = std::operator<<(poVar5,psVar8);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string(local_c8);
      local_4 = 1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

Int ForrestTomlin::_Update(double pivot) {
    Int num_updates = replaced_.size();
    assert(have_ftran_);
    assert(have_btran_);

    // Find the position of the entry with row index replace_next_ in spike.
    // If not present, we will have where == qend.
    assert(replace_next_ >= 0);
    Int qend = U_.queue_size();
    Int where = 0;
    while (where < qend && U_.qindex(where) != replace_next_)
        where++;

    // Compute new diagonal entry of U. newdiag1 will be inserted into U;
    // newdiag2 would be the same in exact arithmetic and is for monitoring
    // numerical stability.
    double olddiag = U_.value(U_.end(replace_next_)-1);
    double newdiag1 = pivot * olddiag;
    double newdiag2 = (where == qend ? 0.0 : U_.qvalue(where)) -
        SparseDot(U_, R_);
    double newdiag_err = std::abs(newdiag1-newdiag2);
    double rel_newdiag_err = newdiag_err / std::abs(newdiag1);

    // Put new diagonal entry at end of spike.
    if (where < qend) {
        for (Int l = where; l < qend-1; l++) {
            U_.qindex(l) = U_.qindex(l+1);
            U_.qvalue(l) = U_.qvalue(l+1);
        }
        U_.qindex(qend-1) = dim_+num_updates;
        U_.qvalue(qend-1) = newdiag1;
    } else {
        U_.push_back(dim_+num_updates, newdiag1);
    }

    // Overwrite replaced column by unit column in U.
    Int end = U_.end(replace_next_);
    for (Int l = U_.begin(replace_next_); l < end-1; l++)
        U_.value(l) = 0.0;
    U_.value(end-1) = 1.0;

    // Finish update.
    U_.add_column();
    R_.add_column();
    replaced_.push_back(replace_next_);
    replace_next_ = -1;
    have_btran_ = false;
    have_ftran_ = false;

    if (newdiag1 == 0.0)
        return -1;

    // Print a debugging message if a new eta entry is large.
    double max_eta = 0.0;
    for (Int l = R_.begin(num_updates); l < R_.end(num_updates); l++)
        max_eta = std::max(max_eta, std::abs(R_.value(l)));
    if (max_eta > 1e10)
        control_.Debug(3) << " max eta = " << sci2(max_eta) << '\n';

    // stability check
    if (rel_newdiag_err > kFtDiagErrorTol) {
        control_.Debug(3)
            << " relative error in new diagonal entry of U = "
            << sci2(rel_newdiag_err) << '\n';
        return 1;
    }
    return 0;
}